

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

bool __thiscall
TPZMatrix<std::complex<long_double>_>::Compare
          (TPZMatrix<std::complex<long_double>_> *this,TPZSavable *copy,bool override)

{
  undefined2 uVar1;
  int64_t iVar2;
  long lVar3;
  ostream *poVar4;
  stringstream sout;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if (copy != (TPZSavable *)0x0) {
    lVar3 = __dynamic_cast(copy,&TPZSavable::typeinfo,
                           &TPZMatrix<std::complex<long_double>>::typeinfo,0);
    if (lVar3 == 0) {
      return false;
    }
    if ((((this->super_TPZBaseMatrix).fRow == *(long *)(lVar3 + 8)) &&
        ((this->super_TPZBaseMatrix).fCol == *(long *)(lVar3 + 0x10))) &&
       ((this->super_TPZBaseMatrix).fDecomposed == *(char *)(lVar3 + 0x18))) {
      return true;
    }
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar4 = std::operator<<(local_198,
                             "virtual bool TPZMatrix<std::complex<long double>>::Compare(TPZSavable *, bool) [T = std::complex<long double>]"
                            );
    std::operator<<(poVar4," did not compare ");
    std::__cxx11::stringbuf::str();
    poVar4 = std::operator<<((ostream *)&std::cout,asStack_1c8);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string(asStack_1c8);
    std::__cxx11::stringstream::~stringstream(local_1a8);
    if (override) {
      uVar1 = *(undefined2 *)(lVar3 + 0x18);
      (this->super_TPZBaseMatrix).fDecomposed = (char)uVar1;
      (this->super_TPZBaseMatrix).fDefPositive = (char)((ushort)uVar1 >> 8);
      iVar2 = *(int64_t *)(lVar3 + 0x10);
      (this->super_TPZBaseMatrix).fRow = *(int64_t *)(lVar3 + 8);
      (this->super_TPZBaseMatrix).fCol = iVar2;
    }
  }
  return false;
}

Assistant:

bool TPZMatrix<TVar>::Compare(TPZSavable *copy, bool override)
{
	TPZMatrix<TVar> *copmat = dynamic_cast<TPZMatrix<TVar> *> (copy);
	if(!copmat) return false;
	bool result = true;
	if(fRow != copmat->fRow || fCol != copmat->fCol || fDecomposed != copmat->fDecomposed) result = false;
	if(!result)
	{
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " did not compare ";
		LOGPZ_ERROR(loggerCheck,sout.str())
	}
	if(override && !result)
	{
		this->operator=(*copmat);
	}
	return result;
}